

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qassociativeiterable.cpp
# Opt level: O1

void __thiscall
QAssociativeIterable::setValue(QAssociativeIterable *this,QVariant *key,QVariant *mapped)

{
  ulong uVar1;
  void *pvVar2;
  long in_FS_OFFSET;
  QMetaAssociation meta;
  QMetaType local_80;
  QMetaType local_78;
  QMetaContainer local_70;
  anon_union_24_3_e3d07ef4_for_data local_68;
  undefined8 local_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined8 local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.shared = (PrivateShared *)0x0;
  local_48._8_8_ = 0;
  local_48._16_8_ = 0;
  local_30 = 2;
  local_68.shared = (PrivateShared *)0x0;
  local_68._8_8_ = 0;
  local_68._16_8_ = 0;
  local_50 = 2;
  local_70.d_ptr =
       (this->super_QIterable<QMetaAssociation>).m_metaContainer.super_QMetaContainer.d_ptr;
  uVar1 = (this->super_QIterable<QMetaAssociation>).m_iterable.m_pointer.d;
  local_78 = QMetaAssociation::keyMetaType((QMetaAssociation *)&local_70);
  pvVar2 = QtPrivate::QVariantTypeCoercer::coerce((QVariantTypeCoercer *)&local_48,key,&local_78);
  local_80 = QMetaAssociation::mappedMetaType((QMetaAssociation *)&local_70);
  QtPrivate::QVariantTypeCoercer::coerce((QVariantTypeCoercer *)&local_68,mapped,&local_80);
  if ((local_70.d_ptr != (QMetaContainerInterface *)0x0) &&
     (local_70.d_ptr[1].copyIteratorFn != (CopyIteratorFn)0x0)) {
    (*local_70.d_ptr[1].copyIteratorFn)
              ((void *)(-(ulong)((uint)uVar1 & 1) & uVar1 & 0xfffffffffffffffe),pvVar2);
  }
  ::QVariant::~QVariant((QVariant *)&local_68);
  ::QVariant::~QVariant((QVariant *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAssociativeIterable::setValue(const QVariant &key, const QVariant &mapped)
{
    QtPrivate::QVariantTypeCoercer keyCoercer;
    QtPrivate::QVariantTypeCoercer mappedCoercer;
    QMetaAssociation meta = metaContainer();
    meta.setMappedAtKey(mutableIterable(), keyCoercer.coerce(key, meta.keyMetaType()),
                        mappedCoercer.coerce(mapped, meta.mappedMetaType()));
}